

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testInit(XFBExceedBufferLimitTest *this)

{
  GLuint c;
  CASES CVar1;
  GLuint stage;
  STAGES SVar2;
  testCase test_case;
  value_type local_28;
  
  for (CVar1 = BLOCK; CVar1 != CASE_MAX; CVar1 = CVar1 + GLOBAL) {
    for (SVar2 = COMPUTE; SVar2 != STAGE_MAX; SVar2 = SVar2 + VERTEX) {
      if (SVar2 != FRAGMENT && (SVar2 & FRAGMENT) != COMPUTE) {
        local_28.m_stage = SVar2;
        local_28.m_case = CVar1;
        std::
        vector<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedBufferLimitTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_28);
      }
    }
  }
  return;
}

Assistant:

void XFBExceedBufferLimitTest::testInit()
{
	for (GLuint c = 0; c < CASE_MAX; ++c)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if ((Utils::Shader::COMPUTE == stage) || (Utils::Shader::TESS_CTRL == stage) ||
				(Utils::Shader::FRAGMENT == stage))
			{
				continue;
			}

			testCase test_case = { (CASES)c, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}